

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void * __thiscall vector<int>::realloc(vector<int> *this,void *__ptr,size_t __size)

{
  int *piVar1;
  uint uVar2;
  void *in_RAX;
  int *__s;
  void *extraout_RAX;
  int i;
  long lVar3;
  
  uVar2 = 1;
  if (1 < (int)(uint)__ptr) {
    uVar2 = (uint)__ptr;
  }
  if (this->_capacity != uVar2) {
    __s = (int *)operator_new__((ulong)uVar2 << 2);
    memset(__s,0,(ulong)uVar2 << 2);
    in_RAX = (void *)(long)this->_size;
    piVar1 = this->vect;
    for (lVar3 = 0; lVar3 < (long)in_RAX; lVar3 = lVar3 + 1) {
      __s[lVar3] = piVar1[lVar3];
    }
    this->_capacity = uVar2;
    if (piVar1 != (int *)0x0) {
      operator_delete__(piVar1);
      in_RAX = extraout_RAX;
    }
    this->vect = __s;
  }
  return in_RAX;
}

Assistant:

inline T max(const T& a, const T& b) {
    return (a < b) ? b : a;
}